

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::find_common<1>(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *this;
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  vm_val_t *pvVar4;
  int iVar5;
  int32_t iVar6;
  ushort *substr;
  char *pcVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *str_00;
  uint uVar11;
  CVmObjPattern *pat;
  byte *len;
  byte *basestr;
  int match_idx;
  ushort *local_48;
  vm_val_t *local_40;
  int match_len;
  
  if (argc == (uint *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *argc;
  }
  local_40 = self_val;
  if (find_common<1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    find_common<1>();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&find_common<1>::desc);
  pvVar4 = sp_;
  if (iVar5 != 0) {
    return 1;
  }
  uVar1 = *(ushort *)str;
  len = (byte *)(ulong)uVar1;
  this = sp_ + -1;
  substr = (ushort *)vm_val_t::get_as_string(this);
  iVar5 = 0;
  if (substr == (ushort *)0x0) {
    local_48 = substr;
    if ((this->typ != VM_OBJ) ||
       (uVar2 = pvVar4[-1].val.obj,
       iVar8 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 8))
                         (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),
                          CVmObjPattern::metaclass_reg_), iVar8 == 0)) {
      err_throw(0x900);
    }
    uVar2 = pvVar4[-1].val.obj;
    pat = (CVmObjPattern *)
          ((long)&G_obj_table_X.pages_[uVar2 >> 0xc]->ptr_ + (ulong)((uVar2 & 0xfff) * 0x18));
    substr = local_48;
  }
  else {
    pat = (CVmObjPattern *)0x0;
  }
  basestr = (byte *)(str + 2);
  str_00 = basestr;
  if ((1 < uVar11) && (sp_[-2].typ != VM_NIL)) {
    if (sp_[-2].typ == VM_INT) {
      iVar6 = sp_[-2].val.intval;
    }
    else {
      iVar6 = vm_val_t::nonint_num_to_int(sp_ + -2);
    }
    iVar5 = -1;
    if (iVar6 < 0) {
      if (len == (byte *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        pbVar9 = basestr;
        do {
          pbVar9 = pbVar9 + (ulong)(((*pbVar9 >> 5 & 1) != 0) + 1 & (uint)(*pbVar9 >> 7) * 3) + 1;
          iVar5 = iVar5 + 1;
        } while (pbVar9 < basestr + (long)len);
      }
    }
    iVar5 = iVar5 + iVar6;
    if (substr == (ushort *)0x0) {
      pbVar9 = (byte *)0x0;
    }
    else {
      pbVar9 = (byte *)(ulong)*substr;
    }
    bVar3 = 0 < iVar5;
    if ((0 < iVar5) && ((uint)pbVar9 < (uint)uVar1)) {
      iVar8 = 1;
      pbVar10 = basestr;
      do {
        str_00 = pbVar10 + (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) + 1;
        len = pbVar10 + ((long)len - (long)str_00);
        bVar3 = iVar8 < iVar5;
        if (iVar5 <= iVar8) break;
        iVar8 = iVar8 + 1;
        pbVar10 = str_00;
      } while (pbVar9 < len);
    }
    iVar8 = 0;
    if (bVar3) {
      retval->typ = VM_NIL;
      iVar8 = 5;
      str_00 = basestr;
    }
    if (iVar8 == 5) goto LAB_002c1b0e;
    if (iVar8 != 0) {
      return 1;
    }
  }
  pcVar7 = find_substr(local_40,(char *)basestr,(char *)str_00,(size_t)len,(char *)substr,pat,
                       &match_idx,&match_len);
  if (pcVar7 == (char *)0x0) {
    retval->typ = VM_NIL;
  }
  else {
    retval->typ = VM_INT;
    (retval->val).obj = match_idx + iVar5 + 1;
  }
LAB_002c1b0e:
  sp_ = sp_ + -(long)(int)uVar11;
  return 1;
}

Assistant:

inline int CVmObjString::find_common(
    VMG_ vm_val_t *retval,
    const vm_val_t *self_val, const char *str,
    uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember where the base string strings */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *val2 = G_stk->get(0);
    const char *str2 = val2->get_as_string(vmg0_);
    CVmObjPattern *pat2 = 0;
    if (str2 != 0)
    {
        /* we have a simple string to find */
    }
    else if (val2->typ == VM_OBJ
             && CVmObjPattern::is_pattern_obj(vmg_ val2->val.obj))
    {
        /* it's a pattern */
        pat2 = (CVmObjPattern *)vm_objp(vmg_ val2->val.obj);
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if there's a starting index, skip that many characters */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character.  For reverse searches, 0 is the
         *   position past the last character.  In any case, adjust to a
         *   zero-based index.
         */
        start_idx += (start_idx == 0 && dir < 0 ? (int)strp.len(len) :
                      start_idx < 0 ? (int)strp.len(len) :
                      -1);

        /* if there's a substring, we can limit the skip */
        size_t min_len = (dir > 0 && str2 != 0 ? vmb_get_len(str2) : 0);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > min_len ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }
    else if (dir < 0)
    {
        /* 
         *   we're searching backwards, and there's no starting index, so the
         *   starting point is the end of the string 
         */
        str = str + len;
        start_idx = utf8_ptr::s_len(basestr, len);
        len = 0;
    }

    /* find the substring */
    int match_idx, match_len;
    if (dir > 0
        ? find_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                      &match_idx, &match_len) != 0
        : find_last_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                           &match_idx, &match_len) != 0)
    {
        /* found it - adjust to a 1-based value for return */
        retval->set_int(start_idx + match_idx + 1);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}